

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_parameter.hpp
# Opt level: O1

void __thiscall
ruckig::OutputParameter<3UL,_ruckig::StandardVector>::~OutputParameter
          (OutputParameter<3UL,_ruckig::StandardVector> *this)

{
  pointer pdVar1;
  pointer paVar2;
  
  pdVar1 = (this->trajectory).cumulative_times.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->trajectory).cumulative_times.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  paVar2 = (this->trajectory).profiles.
           super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->trajectory).profiles.
                                 super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
    return;
  }
  return;
}

Assistant:

void resize(size_t dofs) {
        new_position.resize(dofs);
        new_velocity.resize(dofs);
        new_acceleration.resize(dofs);
        new_jerk.resize(dofs);
    }